

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O1

char * nn_symbol(int i,int *value)

{
  int *piVar1;
  
  if (0x77 < (uint)i) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    return (char *)0x0;
  }
  if (value != (int *)0x0) {
    *value = sym_value_names[(uint)i].value;
  }
  return sym_value_names[(uint)i].name;
}

Assistant:

const char *nn_symbol (int i, int *value)
{
    const struct nn_symbol_properties *svn;
    if (i < 0 || i >= SYM_VALUE_NAMES_LEN) {
        errno = EINVAL;
        return NULL;
    }

    svn = &sym_value_names [i];
    if (value)
        *value = svn->value;
    return svn->name;
}